

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O0

int mbedtls_hkdf_extract
              (mbedtls_md_info_t *md,uchar *salt,size_t salt_len,uchar *ikm,size_t ikm_len,
              uchar *prk)

{
  byte bVar1;
  int iVar2;
  size_t hash_len;
  uchar null_salt [64];
  uchar *prk_local;
  size_t ikm_len_local;
  uchar *ikm_local;
  size_t salt_len_local;
  uchar *salt_local;
  mbedtls_md_info_t *md_local;
  
  memset(&hash_len,0,0x40);
  ikm_local = (uchar *)salt_len;
  salt_len_local = (size_t)salt;
  if (salt == (uchar *)0x0) {
    if (salt_len != 0) {
      return -0x5f80;
    }
    bVar1 = mbedtls_md_get_size(md);
    ikm_local = (uchar *)(ulong)bVar1;
    if (ikm_local == (uchar *)0x0) {
      return -0x5f80;
    }
    salt_len_local = (size_t)&hash_len;
  }
  iVar2 = mbedtls_md_hmac(md,(uchar *)salt_len_local,(size_t)ikm_local,ikm,ikm_len,prk);
  return iVar2;
}

Assistant:

int mbedtls_hkdf_extract( const mbedtls_md_info_t *md,
                          const unsigned char *salt, size_t salt_len,
                          const unsigned char *ikm, size_t ikm_len,
                          unsigned char *prk )
{
    unsigned char null_salt[MBEDTLS_MD_MAX_SIZE] = { '\0' };

    if( salt == NULL )
    {
        size_t hash_len;

        if( salt_len != 0 )
        {
            return MBEDTLS_ERR_HKDF_BAD_INPUT_DATA;
        }

        hash_len = mbedtls_md_get_size( md );

        if( hash_len == 0 )
        {
            return MBEDTLS_ERR_HKDF_BAD_INPUT_DATA;
        }

        salt = null_salt;
        salt_len = hash_len;
    }

    return( mbedtls_md_hmac( md, salt, salt_len, ikm, ikm_len, prk ) );
}